

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

int fl_wait(double time_to_wait)

{
  uint uVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  fd_set *pfVar7;
  ulong uVar8;
  fd_set *pfVar9;
  ushort uVar10;
  timeval *__timeout;
  int i;
  long lVar11;
  bool bVar12;
  byte bVar13;
  timeval t;
  fd_set fdt [3];
  timeval local_1a8;
  fd_set local_198;
  fd_set local_118;
  fd_set fStack_98;
  
  bVar13 = 0;
  if ((fl_display != (Display *)0x0) && (iVar2 = XQLength(), iVar2 != 0)) {
    do_queued_events();
    return 1;
  }
  pfVar7 = fdsets;
  pfVar9 = &local_198;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar9->fds_bits[0] = pfVar7->fds_bits[0];
    pfVar7 = (fd_set *)((long)pfVar7 + ((ulong)bVar13 * -2 + 1) * 8);
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  pfVar7 = fdsets + 1;
  pfVar9 = &local_118;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar9->fds_bits[0] = pfVar7->fds_bits[0];
    pfVar7 = (fd_set *)((long)pfVar7 + ((ulong)bVar13 * -2 + 1) * 8);
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  pfVar7 = fdsets + 2;
  pfVar9 = &fStack_98;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pfVar9->fds_bits[0] = pfVar7->fds_bits[0];
    pfVar7 = (fd_set *)((long)pfVar7 + ((ulong)bVar13 * -2 + 1) * 8);
    pfVar9 = (fd_set *)((long)pfVar9 + ((ulong)bVar13 * -2 + 1) * 8);
  }
  (*fl_unlock_function)();
  if (2147483.648 <= time_to_wait) {
    __timeout = (timeval *)0x0;
  }
  else {
    local_1a8.tv_sec = (__time_t)(int)time_to_wait;
    __timeout = &local_1a8;
    local_1a8.tv_usec = (__suseconds_t)(int)((time_to_wait - (double)(int)time_to_wait) * 1000000.0)
    ;
  }
  iVar2 = select(maxfd + 1,&local_198,&local_118,&fStack_98,__timeout);
  (*fl_lock_function)();
  if ((0 < iVar2) && (0 < nfds)) {
    lVar5 = 0x10;
    lVar11 = 0;
    do {
      uVar1 = *(uint *)((long)fd + lVar5 + -0x10);
      uVar4 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar4 = uVar1;
      }
      iVar6 = (int)uVar4 >> 6;
      uVar8 = (ulong)uVar1;
      bVar12 = ((ulong)local_198.fds_bits[iVar6] >> (uVar8 & 0x3f) & 1) != 0;
      uVar3 = bVar12 + 4;
      if (((ulong)local_118.fds_bits[iVar6] >> (uVar8 & 0x3f) & 1) == 0) {
        uVar3 = (ushort)bVar12;
      }
      uVar10 = uVar3 + 8;
      if (((ulong)fStack_98.fds_bits[iVar6] >> (uVar8 & 0x3f) & 1) == 0) {
        uVar10 = uVar3;
      }
      if ((*(ushort *)((long)fd + lVar5 + -0xc) & uVar10) != 0) {
        (**(code **)((long)fd + lVar5 + -8))(uVar1,*(undefined8 *)((long)&fd->fd + lVar5));
      }
      lVar11 = lVar11 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar11 < nfds);
  }
  return iVar2;
}

Assistant:

int fl_wait(double time_to_wait) {

  // OpenGL and other broken libraries call XEventsQueued
  // unnecessarily and thus cause the file descriptor to not be ready,
  // so we must check for already-read events:
  if (fl_display && XQLength(fl_display)) {do_queued_events(); return 1;}

#  if !USE_POLL
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
#  endif
  int n;

  fl_unlock_function();

  if (time_to_wait < 2147483.648) {
#  if USE_POLL
    n = ::poll(pollfds, nfds, int(time_to_wait*1000 + .5));
#  else
    timeval t;
    t.tv_sec = int(time_to_wait);
    t.tv_usec = int(1000000 * (time_to_wait-t.tv_sec));
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
  } else {
#  if USE_POLL
    n = ::poll(pollfds, nfds, -1);
#  else
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],0);
#  endif
  }

  fl_lock_function();

  if (n > 0) {
    for (int i=0; i<nfds; i++) {
#  if USE_POLL
      if (pollfds[i].revents) fd[i].cb(pollfds[i].fd, fd[i].arg);
#  else
      int f = fd[i].fd;
      short revents = 0;
      if (FD_ISSET(f,&fdt[0])) revents |= POLLIN;
      if (FD_ISSET(f,&fdt[1])) revents |= POLLOUT;
      if (FD_ISSET(f,&fdt[2])) revents |= POLLERR;
      if (fd[i].events & revents) fd[i].cb(f, fd[i].arg);
#  endif
    }
  }
  return n;
}